

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O2

state_status_t
tchecker::zg::next(system_t *system,vloc_sptr_t *vloc,intval_sptr_t *intval,zone_sptr_t *zone,
                  vedge_sptr_t *vedge,sync_id_t *sync_id,clock_constraint_container_t *src_invariant
                  ,clock_constraint_container_t *guard,clock_reset_container_t *reset,
                  clock_constraint_container_t *tgt_invariant,semantics_t *semantics,
                  extrapolation_t *extrapolation,outgoing_edges_value_t *sync_edges)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  state_status_t sVar4;
  vloc_t *pvVar5;
  zone_t *this;
  db_t *pdVar6;
  make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *pmVar7;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar8;
  
  pvVar5 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
            operator*(vloc)->super_vloc_t;
  bVar2 = ta::delay_allowed(system,pvVar5);
  sVar4 = ta::next(system,vloc,intval,vedge,sync_id,src_invariant,guard,reset,tgt_invariant,
                   sync_edges);
  if (sVar4 == 1) {
    this = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
            ::operator->(zone)->super_zone_t;
    pdVar6 = zone_t::dbm(this);
    pmVar7 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
             ::operator->(zone);
    uVar1 = (pmVar7->super_zone_t)._dim;
    pvVar5 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
              ::operator*(vloc)->super_vloc_t;
    bVar3 = ta::delay_allowed(system,pvVar5);
    sVar4 = (*semantics->_vptr_semantics_t[4])
                      (semantics,pdVar6,(ulong)uVar1,(ulong)bVar2,src_invariant,guard,reset,
                       (ulong)bVar3,tgt_invariant);
    if (sVar4 == 1) {
      pmVar8 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
               ::operator*(vloc);
      (*extrapolation->_vptr_extrapolation_t[2])(extrapolation,pdVar6,(ulong)uVar1,pmVar8);
      sVar4 = 1;
    }
  }
  return sVar4;
}

Assistant:

tchecker::state_status_t next(tchecker::ta::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                              tchecker::intval_sptr_t const & intval, tchecker::zg::zone_sptr_t const & zone,
                              tchecker::vedge_sptr_t const & vedge, tchecker::sync_id_t & sync_id,
                              tchecker::clock_constraint_container_t & src_invariant,
                              tchecker::clock_constraint_container_t & guard, tchecker::clock_reset_container_t & reset,
                              tchecker::clock_constraint_container_t & tgt_invariant, tchecker::zg::semantics_t & semantics,
                              tchecker::zg::extrapolation_t & extrapolation,
                              tchecker::zg::outgoing_edges_value_t const & sync_edges)
{
  bool src_delay_allowed = tchecker::ta::delay_allowed(system, *vloc);

  tchecker::state_status_t status =
      tchecker::ta::next(system, vloc, intval, vedge, sync_id, src_invariant, guard, reset, tgt_invariant, sync_edges);
  if (status != tchecker::STATE_OK)
    return status;

  tchecker::dbm::db_t * dbm = zone->dbm();
  tchecker::clock_id_t dim = zone->dim();
  bool tgt_delay_allowed = tchecker::ta::delay_allowed(system, *vloc);

  status = semantics.next(dbm, dim, src_delay_allowed, src_invariant, guard, reset, tgt_delay_allowed, tgt_invariant);
  if (status != tchecker::STATE_OK)
    return status;

  extrapolation.extrapolate(dbm, dim, *vloc);

  return tchecker::STATE_OK;
}